

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O0

void __thiscall wasm::Vacuum::visitTryTable(Vacuum *this,TryTable *curr)

{
  bool bVar1;
  PassOptions *passOptions;
  Module *module;
  EffectAnalyzer local_178;
  TryTable *local_18;
  TryTable *curr_local;
  Vacuum *this_local;
  
  local_18 = curr;
  curr_local = (TryTable *)this;
  passOptions = Pass::getPassOptions((Pass *)this);
  module = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                     ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                      &(this->
                       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                       ).
                       super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                     );
  EffectAnalyzer::EffectAnalyzer(&local_178,passOptions,module,local_18->body);
  bVar1 = EffectAnalyzer::throws(&local_178);
  EffectAnalyzer::~EffectAnalyzer(&local_178);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               local_18->body);
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
    // If try_table's body does not throw, the whole try_table can be replaced
    // with the try_table's body.
    if (!EffectAnalyzer(getPassOptions(), *getModule(), curr->body).throws()) {
      replaceCurrent(curr->body);
      return;
    }
  }